

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O2

int copy_out(archive_write *a,uint64_t offset,uint64_t length)

{
  long *plVar1;
  ulong uVar2;
  int iVar3;
  __off_t _Var4;
  ssize_t sVar5;
  int *piVar6;
  ulong __nbytes;
  char *fmt;
  
  piVar6 = (int *)a->format_data;
  _Var4 = lseek(*piVar6,offset,0);
  if (_Var4 < 0) {
    piVar6 = __errno_location();
    iVar3 = *piVar6;
    fmt = "lseek failed";
LAB_001595e4:
    archive_set_error(&a->archive,iVar3,fmt);
LAB_001595eb:
    iVar3 = -0x1e;
  }
  else {
    do {
      if (length == 0) {
        return 0;
      }
      uVar2 = *(ulong *)(piVar6 + 0x4048);
      __nbytes = uVar2;
      if (length < uVar2) {
        __nbytes = length;
      }
      sVar5 = read(*piVar6,(void *)((long)piVar6 + (0x10120 - uVar2)),__nbytes);
      if (sVar5 < 0) {
        piVar6 = __errno_location();
        archive_set_error(&a->archive,*piVar6,"Can\'t read temporary file(%jd)",sVar5);
        goto LAB_001595eb;
      }
      if (sVar5 == 0) {
        fmt = "Truncated xar archive";
        iVar3 = 0;
        goto LAB_001595e4;
      }
      length = length - sVar5;
      plVar1 = (long *)(piVar6 + 0x4048);
      *plVar1 = *plVar1 - sVar5;
    } while ((*plVar1 != 0) || (iVar3 = flush_wbuff(a), iVar3 == 0));
  }
  return iVar3;
}

Assistant:

static int
copy_out(struct archive_write *a, uint64_t offset, uint64_t length)
{
	struct xar *xar;
	int r;

	xar = (struct xar *)a->format_data;
	if (lseek(xar->temp_fd, offset, SEEK_SET) < 0) {
		archive_set_error(&(a->archive), errno, "lseek failed");
		return (ARCHIVE_FATAL);
	}
	while (length) {
		size_t rsize;
		ssize_t rs;
		unsigned char *wb;

		if (length > xar->wbuff_remaining)
			rsize = xar->wbuff_remaining;
		else
			rsize = (size_t)length;
		wb = xar->wbuff + (sizeof(xar->wbuff) - xar->wbuff_remaining);
		rs = read(xar->temp_fd, wb, rsize);
		if (rs < 0) {
			archive_set_error(&(a->archive), errno,
			    "Can't read temporary file(%jd)",
			    (intmax_t)rs);
			return (ARCHIVE_FATAL);
		}
		if (rs == 0) {
			archive_set_error(&(a->archive), 0,
			    "Truncated xar archive");
			return (ARCHIVE_FATAL);
		}
		xar->wbuff_remaining -= rs;
		length -= rs;
		if (xar->wbuff_remaining == 0) {
			r = flush_wbuff(a);
			if (r != ARCHIVE_OK)
				return (r);
		}
	}
	return (ARCHIVE_OK);
}